

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_ppt(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  int iVar2;
  jpc_ppxstab_t *pjVar3;
  jpc_ppxstabent_t *ent;
  jpc_ppxstabent_t *pptstabent;
  jpc_dec_tile_t *tile;
  jpc_ppt_t *ppt;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  pjVar1 = dec->curtile;
  if (pjVar1->pptstab == (jpc_ppxstab_t *)0x0) {
    pjVar3 = jpc_ppxstab_create();
    pjVar1->pptstab = pjVar3;
    if (pjVar3 == (jpc_ppxstab_t *)0x0) {
      return -1;
    }
  }
  ent = jpc_ppxstabent_create();
  if (ent == (jpc_ppxstabent_t *)0x0) {
    dec_local._4_4_ = -1;
  }
  else {
    ent->ind = (ulong)(ms->parms).cod.csty;
    ent->data = (uchar *)(ms->parms).siz.height;
    (ms->parms).siz.height = 0;
    ent->len = (ms->parms).sot.len;
    iVar2 = jpc_ppxstab_insert(pjVar1->pptstab,ent);
    if (iVar2 == 0) {
      dec_local._4_4_ = 0;
    }
    else {
      dec_local._4_4_ = -1;
    }
  }
  return dec_local._4_4_;
}

Assistant:

static int jpc_dec_process_ppt(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_ppt_t *ppt = &ms->parms.ppt;
	jpc_dec_tile_t *tile;
	jpc_ppxstabent_t *pptstabent;

	tile = dec->curtile;
	if (!tile->pptstab) {
		if (!(tile->pptstab = jpc_ppxstab_create())) {
			return -1;
		}
	}
	if (!(pptstabent = jpc_ppxstabent_create())) {
		return -1;
	}
	pptstabent->ind = ppt->ind;
	pptstabent->data = ppt->data;
	ppt->data = 0;
	pptstabent->len = ppt->len;
	if (jpc_ppxstab_insert(tile->pptstab, pptstabent)) {
		return -1;
	}
	return 0;
}